

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_CipherProperties_Test::TestBody(SSLTest_CipherProperties_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  int *piVar3;
  EVP_MD *md;
  char *in_R9;
  AssertHelper local_1a8;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_6;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_5;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  SSL_CIPHER *local_40;
  SSL_CIPHER *cipher;
  anon_struct_40_7_668fc8ab *paStack_30;
  ScopedTrace gtest_trace_1107;
  anon_struct_40_7_668fc8ab *t;
  anon_struct_40_7_668fc8ab *__end2;
  anon_struct_40_7_668fc8ab *__begin2;
  anon_struct_40_7_668fc8ab (*__range2) [13];
  SSLTest_CipherProperties_Test *this_local;
  
  __end2 = TestBody::kTests;
  while( true ) {
    if (__end2 == (anon_struct_40_7_668fc8ab *)
                  &testing::internal::
                   TestFactoryImpl<bssl::(anonymous_namespace)::SSLTest_Padding_Test>::vtable) {
      return;
    }
    paStack_30 = __end2;
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)((long)&cipher + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x453,__end2->standard_name);
    local_40 = SSL_get_cipher_by_value((uint16_t)paStack_30->id);
    testing::AssertionResult::AssertionResult<ssl_cipher_st_const*>
              ((AssertionResult *)local_60,&local_40,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_60,(AssertionResult *)0x4e0df2,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x456,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      testing::Message::~Message(&local_68);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar2 = paStack_30->standard_name;
      rhs = SSL_CIPHER_standard_name(local_40);
      testing::internal::CmpHelperSTREQ
                ((internal *)local_a8,"t.standard_name","SSL_CIPHER_standard_name(cipher)",pcVar2,
                 rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x457,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      piVar3 = &paStack_30->cipher_nid;
      local_cc = SSL_CIPHER_get_cipher_nid(local_40);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_c8,"t.cipher_nid","SSL_CIPHER_get_cipher_nid(cipher)",piVar3,
                 &local_cc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x459,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      piVar3 = &paStack_30->digest_nid;
      local_f4 = SSL_CIPHER_get_digest_nid(local_40);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_f0,"t.digest_nid","SSL_CIPHER_get_digest_nid(cipher)",piVar3,
                 &local_f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x45a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      piVar3 = &paStack_30->kx_nid;
      local_11c = SSL_CIPHER_get_kx_nid(local_40);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_118,"t.kx_nid","SSL_CIPHER_get_kx_nid(cipher)",piVar3,&local_11c)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x45b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      piVar3 = &paStack_30->auth_nid;
      local_144 = SSL_CIPHER_get_auth_nid(local_40);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_140,"t.auth_nid","SSL_CIPHER_get_auth_nid(cipher)",piVar3,
                 &local_144);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x45c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      piVar3 = &paStack_30->prf_nid;
      md = SSL_CIPHER_get_handshake_digest(local_40);
      local_16c = EVP_MD_nid(md);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_168,"t.prf_nid",
                 "EVP_MD_nid(SSL_CIPHER_get_handshake_digest(cipher))",piVar3,&local_16c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x45d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_178);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      piVar3 = &paStack_30->prf_nid;
      local_194 = SSL_CIPHER_get_prf_nid(local_40);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_190,"t.prf_nid","SSL_CIPHER_get_prf_nid(cipher)",piVar3,
                 &local_194);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x45e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&cipher + 7));
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) break;
    __end2 = __end2 + 1;
  }
  return;
}

Assistant:

TEST(SSLTest, CipherProperties) {
  static const struct {
    int id;
    const char *standard_name;
    int cipher_nid;
    int digest_nid;
    int kx_nid;
    int auth_nid;
    int prf_nid;
  } kTests[] = {
      {
          SSL3_CK_RSA_DES_192_CBC3_SHA,
          "TLS_RSA_WITH_3DES_EDE_CBC_SHA",
          NID_des_ede3_cbc,
          NID_sha1,
          NID_kx_rsa,
          NID_auth_rsa,
          NID_md5_sha1,
      },
      {
          TLS1_CK_RSA_WITH_AES_128_SHA,
          "TLS_RSA_WITH_AES_128_CBC_SHA",
          NID_aes_128_cbc,
          NID_sha1,
          NID_kx_rsa,
          NID_auth_rsa,
          NID_md5_sha1,
      },
      {
          TLS1_CK_PSK_WITH_AES_256_CBC_SHA,
          "TLS_PSK_WITH_AES_256_CBC_SHA",
          NID_aes_256_cbc,
          NID_sha1,
          NID_kx_psk,
          NID_auth_psk,
          NID_md5_sha1,
      },
      {
          TLS1_CK_ECDHE_RSA_WITH_AES_128_CBC_SHA,
          "TLS_ECDHE_RSA_WITH_AES_128_CBC_SHA",
          NID_aes_128_cbc,
          NID_sha1,
          NID_kx_ecdhe,
          NID_auth_rsa,
          NID_md5_sha1,
      },
      {
          TLS1_CK_ECDHE_RSA_WITH_AES_256_CBC_SHA,
          "TLS_ECDHE_RSA_WITH_AES_256_CBC_SHA",
          NID_aes_256_cbc,
          NID_sha1,
          NID_kx_ecdhe,
          NID_auth_rsa,
          NID_md5_sha1,
      },
      {
          TLS1_CK_ECDHE_RSA_WITH_AES_128_GCM_SHA256,
          "TLS_ECDHE_RSA_WITH_AES_128_GCM_SHA256",
          NID_aes_128_gcm,
          NID_undef,
          NID_kx_ecdhe,
          NID_auth_rsa,
          NID_sha256,
      },
      {
          TLS1_CK_ECDHE_ECDSA_WITH_AES_128_GCM_SHA256,
          "TLS_ECDHE_ECDSA_WITH_AES_128_GCM_SHA256",
          NID_aes_128_gcm,
          NID_undef,
          NID_kx_ecdhe,
          NID_auth_ecdsa,
          NID_sha256,
      },
      {
          TLS1_CK_ECDHE_ECDSA_WITH_AES_256_GCM_SHA384,
          "TLS_ECDHE_ECDSA_WITH_AES_256_GCM_SHA384",
          NID_aes_256_gcm,
          NID_undef,
          NID_kx_ecdhe,
          NID_auth_ecdsa,
          NID_sha384,
      },
      {
          TLS1_CK_ECDHE_PSK_WITH_AES_128_CBC_SHA,
          "TLS_ECDHE_PSK_WITH_AES_128_CBC_SHA",
          NID_aes_128_cbc,
          NID_sha1,
          NID_kx_ecdhe,
          NID_auth_psk,
          NID_md5_sha1,
      },
      {
          TLS1_CK_ECDHE_RSA_WITH_CHACHA20_POLY1305_SHA256,
          "TLS_ECDHE_RSA_WITH_CHACHA20_POLY1305_SHA256",
          NID_chacha20_poly1305,
          NID_undef,
          NID_kx_ecdhe,
          NID_auth_rsa,
          NID_sha256,
      },
      {
          TLS1_3_CK_AES_256_GCM_SHA384,
          "TLS_AES_256_GCM_SHA384",
          NID_aes_256_gcm,
          NID_undef,
          NID_kx_any,
          NID_auth_any,
          NID_sha384,
      },
      {
          TLS1_3_CK_AES_128_GCM_SHA256,
          "TLS_AES_128_GCM_SHA256",
          NID_aes_128_gcm,
          NID_undef,
          NID_kx_any,
          NID_auth_any,
          NID_sha256,
      },
      {
          TLS1_3_CK_CHACHA20_POLY1305_SHA256,
          "TLS_CHACHA20_POLY1305_SHA256",
          NID_chacha20_poly1305,
          NID_undef,
          NID_kx_any,
          NID_auth_any,
          NID_sha256,
      },
  };

  for (const auto &t : kTests) {
    SCOPED_TRACE(t.standard_name);

    const SSL_CIPHER *cipher = SSL_get_cipher_by_value(t.id & 0xffff);
    ASSERT_TRUE(cipher);
    EXPECT_STREQ(t.standard_name, SSL_CIPHER_standard_name(cipher));

    EXPECT_EQ(t.cipher_nid, SSL_CIPHER_get_cipher_nid(cipher));
    EXPECT_EQ(t.digest_nid, SSL_CIPHER_get_digest_nid(cipher));
    EXPECT_EQ(t.kx_nid, SSL_CIPHER_get_kx_nid(cipher));
    EXPECT_EQ(t.auth_nid, SSL_CIPHER_get_auth_nid(cipher));
    EXPECT_EQ(t.prf_nid, EVP_MD_nid(SSL_CIPHER_get_handshake_digest(cipher)));
    EXPECT_EQ(t.prf_nid, SSL_CIPHER_get_prf_nid(cipher));
  }
}